

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_Normalize(NormalizeForm3 Normalize)

{
  bool bVar1;
  uint uVar2;
  byte *pbVar3;
  const_reference pvVar4;
  reference pvVar5;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  undefined6 in_stack_ffffffffffffff10;
  uint8_t in_stack_ffffffffffffff16;
  uint8_t in_stack_ffffffffffffff17;
  byte in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff19;
  byte bVar6;
  undefined1 in_stack_ffffffffffffff1a;
  value_type in_stack_ffffffffffffff1b;
  uint32_t in_stack_ffffffffffffff1c;
  Image *in_stack_ffffffffffffff20;
  Image *image;
  size_type in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  undefined1 local_b8 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined1 local_48 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff0c);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
             CONCAT13(in_stack_ffffffffffffff1b,
                      CONCAT12(in_stack_ffffffffffffff1a,
                               CONCAT11(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18))),
             in_stack_ffffffffffffff17,in_stack_ffffffffffffff16);
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff1c,
             CONCAT13(in_stack_ffffffffffffff1b,
                      CONCAT12(in_stack_ffffffffffffff1a,
                               CONCAT11(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18))),
             (Image *)CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1ddc45);
  Unit_Test::generateRoi
            (in_stack_ffffffffffffff20,
             (uint32_t *)
             CONCAT44(in_stack_ffffffffffffff1c,
                      CONCAT13(in_stack_ffffffffffffff1b,
                               CONCAT12(in_stack_ffffffffffffff1a,
                                        CONCAT11(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18
                                                )))),
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (uint32_t *)0x1ddc66);
  Unit_Test::fillImage
            ((Image *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  (*local_8)(local_b8,local_48,local_80,local_84,local_88,in_stack_ffffffffffffff74);
  image = (Image *)&stack0xffffffffffffff2f;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1ddcca);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(allocator_type *)image);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1ddcea);
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  uVar2 = (uint)*pbVar3;
  pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  if ((uVar2 == *pbVar3) || ((local_88 == 1 && (in_stack_ffffffffffffff74 == 1)))) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
    in_stack_ffffffffffffff1b = *pvVar4;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &stack0xffffffffffffff30,1);
    *pvVar5 = in_stack_ffffffffffffff1b;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &stack0xffffffffffffff30,0);
    *pvVar5 = in_stack_ffffffffffffff1b;
  }
  else {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &stack0xffffffffffffff30,0);
    *pvVar5 = '\0';
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &stack0xffffffffffffff30,1);
    *pvVar5 = 0xff;
  }
  bVar1 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_ffffffffffffff17,
                                       CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)
                                      ),in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  bVar6 = false;
  if (bVar1) {
    bVar6 = Unit_Test::verifyImage
                      (image,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(uVar2,CONCAT13(in_stack_ffffffffffffff1b,
                                                     CONCAT12(bVar1,(ushort)
                                                  in_stack_ffffffffffffff18))),
                       (bool)in_stack_ffffffffffffff17);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dde78);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dde85);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  return (bool)(bVar6 & 1);
}

Assistant:

bool form3_Normalize(NormalizeForm3 Normalize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        PenguinV_Image::Image input = uniformImage();

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        fillImage( input, roiX, roiY, roiWidth, roiHeight, intensity );

        const PenguinV_Image::Image output = Normalize( input, roiX, roiY, roiWidth, roiHeight );

        std::vector < uint8_t > normalized( 2 );

        if( intensity[0] == intensity[1] || (roiWidth == 1 && roiHeight == 1) ) {
            normalized[0] = normalized[1] = intensity[0];
        }
        else {
            normalized[0] = 0;
            normalized[1] = 255;
        }

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, normalized );
    }